

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderMaxOutputComponentsTest::prepareGeometryShader
          (GeometryShaderMaxOutputComponentsTest *this,string *out_shader_code)

{
  ostream *poVar1;
  int iVar2;
  stringstream stream;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GEOMETRY_POINT_SIZE_ENABLE}\n\n// definition of NUMBER_OF_POINTS goes here\n"
             ,0x72);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"#define NUMBER_OF_POINTS ",0x19);
  std::ostream::operator<<((ostream *)local_1a8,this->m_n_output_points);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "u\n\nlayout(points)                                in;\nlayout(points, max_vertices=NUMBER_OF_POINTS) out;\n\n"
             ,0x69);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"// definitions of gs_fs_out_ varyings go here\n",0x2e);
  if (0 < this->m_n_available_vectors) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"flat out ivec4",0xe);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_n_available_vectors);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\nvoid main()\n{\n    int index = 1;\n\n    for (uint point = 0u; point < NUMBER_OF_POINTS; ++point)\n    {\n        // gs_fs_out assignments go here\n"
             ,0x8f);
  if (0 < this->m_n_available_vectors) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"gs_fs_out_",10);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1," = ivec4(index++, index++, index++, index++);\n",0x2e);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->m_n_available_vectors);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n        gl_PointSize = 2.0;\n        gl_Position = vec4(-1.0 + ((2.0 / float(NUMBER_OF_POINTS)) * float(point)) + (1.0 / float(NUMBER_OF_POINTS)), 0.0, 0.0, 1.0);\n\n        EmitVertex();\n        EndPrimitive();\n    }\n}\n"
             ,0xda);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void GeometryShaderMaxOutputComponentsTest::prepareGeometryShader(std::string& out_shader_code) const
{
	std::stringstream stream;

	stream << m_geometry_shader_code_preamble;
	stream << m_common_shader_code_number_of_points;
	stream << m_n_output_points;
	stream << m_geometry_shader_code_layout;
	stream << m_common_shader_code_gs_fs_out_definitions;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << m_geometry_shader_code_flat_out_ivec4 << " " << m_common_shader_code_gs_fs_out << i << ";\n";
	}

	stream << m_geometry_shader_code_body_begin;

	for (int i = 0; i < m_n_available_vectors; ++i)
	{
		stream << "        " << m_common_shader_code_gs_fs_out << i << m_geometry_shader_code_assignment;
	}

	stream << m_geometry_shader_code_body_end;

	out_shader_code = stream.str();
}